

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t __thiscall fmt::v10::detail::code_point_index(detail *this,string_view s,size_t n)

{
  char *pcVar1;
  size_t sVar2;
  size_t size;
  size_t i;
  size_t num_code_points;
  char *data;
  size_t n_local;
  string_view s_local;
  
  s_local.data_ = s.data_;
  n_local = (size_t)this;
  pcVar1 = basic_string_view<char>::data((basic_string_view<char> *)&n_local);
  i = 0;
  size = 0;
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&n_local);
  while( true ) {
    if (size == sVar2) {
      sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&n_local);
      return sVar2;
    }
    if ((((int)pcVar1[size] & 0xc0U) != 0x80) && (i = i + 1, s.size_ < i)) break;
    size = size + 1;
  }
  return size;
}

Assistant:

inline auto code_point_index(string_view s, size_t n) -> size_t {
  const char* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80 && ++num_code_points > n) return i;
  }
  return s.size();
}